

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

int cs_impl::file_system::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  ifstream in;
  byte abStack_500 [488];
  ofstream out;
  byte abStack_2f8 [480];
  char buffer [256];
  
  std::ifstream::ifstream(&in,(string *)dst,_S_in|_S_bin);
  std::ofstream::ofstream(&out,(string *)src,_S_out|_S_bin);
  if (((abStack_500[*(long *)(_in + -0x18)] & 5) == 0) &&
     ((abStack_2f8[*(long *)(_out + -0x18)] & 5) == 0)) {
    while ((abStack_500[*(long *)(_in + -0x18)] & 2) == 0) {
      std::istream::read((char *)&in,(long)buffer);
      std::ostream::write((char *)&out,(long)buffer);
    }
    iVar1 = (int)CONCAT71((int7)((ulong)&in >> 8),1);
  }
  else {
    iVar1 = 0;
  }
  std::ofstream::~ofstream(&out);
  std::ifstream::~ifstream(&in);
  return iVar1;
}

Assistant:

bool copy(const std::string &source, const std::string &dest)
		{
			std::ifstream in(source, std::ios_base::in | std::ios_base::binary);
			std::ofstream out(dest, std::ios_base::out | std::ios_base::binary);
			if (!in || !out)
				return false;
			char buffer[256];
			while (!in.eof()) {
				in.read(buffer, 256);
				out.write(buffer, in.gcount());
			}
			return true;
		}